

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::post_piece_availability(torrent *this)

{
  _Atomic_word *p_Var1;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> this_00;
  int iVar2;
  undefined4 extraout_var;
  vector<int,_piece_index_t> avail;
  vector<int,_piece_index_t> local_48;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> local_28;
  
  local_48.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00._M_head_impl =
       (this->super_torrent_hot_members).m_picker._M_t.
       super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
       ._M_t.
       super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
       .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
  if (this_00._M_head_impl != (piece_picker *)0x0) {
    piece_picker::get_availability(this_00._M_head_impl,&local_48);
  }
  iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [5])();
  get_handle((torrent *)&stack0xffffffffffffffd0);
  alert_manager::
  emplace_alert<libtorrent::piece_availability_alert,libtorrent::torrent_handle,libtorrent::aux::container_wrapper<int,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::vector<int,std::allocator<int>>>>
            ((alert_manager *)CONCAT44(extraout_var,iVar2),
             (torrent_handle *)&stack0xffffffffffffffd0,&local_48);
  if (local_28._M_head_impl != (piece_picker *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._M_head_impl)->
                _M_weak_count;
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._M_head_impl)->_M_weak_count
      ;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._M_head_impl)->_M_weak_count =
           iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._M_head_impl)->
        _vptr__Sp_counted_base[3])();
    }
  }
  if (local_48.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)local_48.super_vector<int,_std::allocator<int>_>.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)local_48.super_vector<int,_std::allocator<int>_>.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void torrent::post_piece_availability()
	{
		aux::vector<int, piece_index_t> avail;
		piece_availability(avail);
		alerts().emplace_alert<piece_availability_alert>(get_handle(), std::move(avail));
	}